

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

parser_error parse_prefs_color(parser *p)

{
  uint uVar1;
  wchar_t wVar2;
  byte *pbVar3;
  prefs_data *d;
  wchar_t idx;
  parser *p_local;
  
  pbVar3 = (byte *)parser_priv(p);
  if (pbVar3 == (byte *)0x0) {
    __assert_fail("d != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                  ,0x406,"enum parser_error parse_prefs_color(struct parser *)");
  }
  if ((*pbVar3 & 1) == 0) {
    uVar1 = parser_getuint(p,"idx");
    if ((int)uVar1 < 0x20) {
      wVar2 = parser_getint(p,"k");
      angband_color_table[(int)uVar1][0] = (uint8_t)wVar2;
      wVar2 = parser_getint(p,"r");
      angband_color_table[(int)uVar1][1] = (uint8_t)wVar2;
      wVar2 = parser_getint(p,"g");
      angband_color_table[(int)uVar1][2] = (uint8_t)wVar2;
      wVar2 = parser_getint(p,"b");
      angband_color_table[(int)uVar1][3] = (uint8_t)wVar2;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    else {
      p_local._4_4_ = PARSE_ERROR_OUT_OF_BOUNDS;
      if ((int)uVar1 < 0x100) {
        p_local._4_4_ = PARSE_ERROR_NONE;
      }
    }
  }
  else {
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_prefs_color(struct parser *p)
{
	int idx;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	idx = parser_getuint(p, "idx");
	if (idx >= MAX_COLORS) {
		/*
		 * Silently ignore indices that would have been in bounds for
		 * Angband 4.2.4 or earlier (color table was 256 then) for
		 * backwards compatibility with existing preference files.
		 * Flag indices that would be out of bounds even with 4.2.4's
		 * bigger color table.
		 */
		return (idx < 256) ?
			PARSE_ERROR_NONE : PARSE_ERROR_OUT_OF_BOUNDS;
	}

	angband_color_table[idx][0] = parser_getint(p, "k");
	angband_color_table[idx][1] = parser_getint(p, "r");
	angband_color_table[idx][2] = parser_getint(p, "g");
	angband_color_table[idx][3] = parser_getint(p, "b");

	return PARSE_ERROR_NONE;
}